

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_>::Resize
          (TPZVec<std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>_> *this,int64_t newsize,
          function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *object)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  ulong in_RSI;
  long in_RDI;
  ulong uVar6;
  int64_t i;
  int64_t large;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *newstore;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff70;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff88;
  function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *in_stack_ffffffffffffff90;
  long lVar7;
  ulong local_68;
  ulong *local_50;
  long local_30;
  ulong *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (ulong *)0x0;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = in_RSI;
      uVar3 = SUB168(auVar2 * ZEXT816(0x20),0);
      uVar6 = uVar3 + 8;
      if (SUB168(auVar2 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar3) {
        uVar6 = 0xffffffffffffffff;
      }
      local_20 = (ulong *)operator_new__(uVar6);
      *local_20 = in_RSI;
      local_20 = local_20 + 1;
      if (in_RSI != 0) {
        local_50 = local_20;
        do {
          std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::function(in_stack_ffffffffffffff70)
          ;
          local_50 = local_50 + 4;
        } while (local_50 != local_20 + in_RSI * 4);
      }
    }
    local_68 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_68 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_30 = 0; local_30 < (long)local_68; local_30 = local_30 + 1) {
      std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    for (; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::operator=
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    if (*(long *)(in_RDI + 8) != 0) {
      lVar7 = *(long *)(in_RDI + 8);
      if (lVar7 != 0) {
        pvVar4 = (void *)(lVar7 + -8);
        lVar1 = *(long *)(lVar7 + -8);
        lVar5 = lVar7 + lVar1 * 0x20;
        if (lVar7 != lVar5) {
          do {
            lVar5 = lVar5 + -0x20;
            std::function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)>::~function
                      ((function<TPZCompEl_*(TPZGeoEl_*,_TPZCompMesh_&)> *)0x19ed76a);
          } while (lVar5 != lVar7);
        }
        operator_delete__(pvVar4,lVar1 * 0x20 + 8);
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(ulong **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}